

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall
djb::microfacet::sample(microfacet *this,vec2 *u,vec3 *wi,vec3 *wo_out,float_t *pdf,void *user_args)

{
  impl *piVar1;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  float_t fVar3;
  float_t fVar4;
  value_type vVar5;
  vec3 vVar6;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  _Var7;
  void *in_stack_00000008;
  vec3 local_104;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  local_f8 [2];
  undefined1 local_d8 [8];
  value_type F;
  float_t Gcd;
  float_t zd;
  float_t local_b8;
  undefined1 local_ac [8];
  vec3 wo;
  float_t local_98;
  undefined1 local_90 [8];
  vec3 wm;
  args args;
  float_t *pdf_local;
  vec3 *wo_out_local;
  vec3 *wi_local;
  vec2 *u_local;
  microfacet *this_local;
  
  if (wo_out->z <= 0.0) {
    if (pdf != (float_t *)0x0) {
      vec3::vec3(&local_104,0.0);
      pdf[0] = local_104.x;
      pdf[1] = local_104.y;
      pdf[2] = local_104.z;
    }
    if (user_args != (void *)0x0) {
      *(undefined4 *)user_args = 0;
    }
    (**(code **)((long)*u + 0x10))(this);
    pfVar2 = extraout_RDX_00;
  }
  else {
    if (in_stack_00000008 == (void *)0x0) {
      microfacet::args::standard();
    }
    else {
      memcpy(&wm.y,in_stack_00000008,0x4c);
    }
    vVar6 = u2_to_h2((microfacet *)u,(vec2 *)wi,wo_out,(args *)&wm.y);
    local_98 = vVar6.z;
    wm.x = local_98;
    wo._4_8_ = vVar6._0_8_;
    local_90._0_4_ = wo.y;
    local_90._4_4_ = wo.z;
    unique0x10000294 = vVar6;
    vVar6 = h2_to_s2((microfacet *)u,(vec3 *)local_90,wo_out);
    _Gcd = vVar6._0_8_;
    local_ac._0_4_ = Gcd;
    local_ac._4_4_ = zd;
    local_b8 = vVar6.z;
    wo.x = local_b8;
    F._M_data._4_4_ = dot(wo_out,(vec3 *)local_90);
    F._M_data._0_4_ = gcd((microfacet *)u,(vec3 *)local_90,wo_out,(vec3 *)local_ac,(args *)&wm.y);
    piVar1 = fresnel::ptr::operator->((ptr *)(u + 1));
    (*piVar1->_vptr_impl[4])((ulong)(uint)F._M_data._4_4_,local_d8);
    if (pdf != (float_t *)0x0) {
      *(undefined1 (*) [8])pdf = local_ac;
      pdf[2] = wo.x;
    }
    if (user_args != (void *)0x0) {
      fVar3 = ndf((microfacet *)u,(vec3 *)local_90,(args *)&wm.y);
      fVar4 = sigma((microfacet *)u,wo_out,(args *)&wm.y);
      *(float *)user_args = fVar3 / (fVar4 * 4.0);
    }
    _Var7 = std::operator*((valarray<float> *)local_d8,(value_type *)&F._M_data);
    local_f8[0]._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr1 =
         _Var7._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr1;
    local_f8[0]._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr2 =
         _Var7._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr2;
    std::valarray<float>::
    valarray<std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_Constant,float,float>>
              ((valarray<float> *)this,local_f8);
    std::valarray<float>::~valarray((valarray<float> *)local_d8);
    pfVar2 = extraout_RDX;
  }
  vVar5._M_data = pfVar2;
  vVar5._M_size = (size_t)this;
  return vVar5;
}

Assistant:

brdf::value_type
microfacet::sample(
	const vec2 &u,
	const vec3 &wi,
	vec3 *wo_out,
	float_t *pdf,
	const void *user_args
) const {
	if (wi.z > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wm = u2_to_h2(u, wi, args);
		vec3 wo = h2_to_s2(wm, wi);
		float_t zd = dot(wi, wm);
		float_t Gcd = gcd(wm, wi, wo, args);
		brdf::value_type F = m_fresnel->eval(zd);

		if (wo_out) (*wo_out) = wo;
		if (pdf) (*pdf) = ndf(wm, args) / (4 * sigma(wi, args));

		return F * Gcd;
	} else {
		if (wo_out) (*wo_out) = vec3(0);
		if (pdf) (*pdf) = 0;

		return zero_value();
	}
}